

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O2

DTDAttDef * __thiscall xercesc_4_0::DTDElementDecl::getAttDef(DTDElementDecl *this,XMLCh *attName)

{
  DTDAttDef *pDVar1;
  
  if (this->fAttDefs == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    return (DTDAttDef *)0x0;
  }
  pDVar1 = RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::get
                     (this->fAttDefs,attName);
  return pDVar1;
}

Assistant:

DTDAttDef* DTDElementDecl::getAttDef(const XMLCh* const attName)
{
    // If no list, then return a null
    if (!fAttDefs)
        return 0;

    return fAttDefs->get(attName);
}